

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Wrap v)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "useMetadata";
    break;
  case 1:
    pcVar1 = "black";
    break;
  case 2:
    pcVar1 = "clamp";
    break;
  case 3:
    pcVar1 = "repeat";
    break;
  case 4:
    pcVar1 = "mirror";
    break;
  default:
    goto switchD_0014ce4f_default;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_0014ce4f_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::UsdUVTexture::Wrap v) {
  std::string s;

  switch (v) {
    case tinyusdz::UsdUVTexture::Wrap::UseMetadata: {
      s = "useMetadata";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Black: {
      s = "black";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Clamp: {
      s = "clamp";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Repeat: {
      s = "repeat";
      break;
    }
    case tinyusdz::UsdUVTexture::Wrap::Mirror: {
      s = "mirror";
      break;
    }
  }

  return s;
}